

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::ConstFunction<int_(int,_int)>::Iface> * __thiscall
kj::Own<kj::ConstFunction<int_(int,_int)>::Iface>::operator=
          (Own<kj::ConstFunction<int_(int,_int)>::Iface> *this,
          Own<kj::ConstFunction<int_(int,_int)>::Iface> *other)

{
  Disposer *this_00;
  Iface *object;
  Iface *ptrCopy;
  Disposer *disposerCopy;
  Own<kj::ConstFunction<int_(int,_int)>::Iface> *other_local;
  Own<kj::ConstFunction<int_(int,_int)>::Iface> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (Iface *)0x0;
  if (object != (Iface *)0x0) {
    Disposer::dispose<kj::ConstFunction<int(int,int)>::Iface>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }